

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

int __thiscall qpdf::Array::size(Array *this)

{
  bool bVar1;
  QPDF_Array *this_00;
  pointer pSVar2;
  size_type sVar3;
  int local_1c;
  QPDF_Array *a;
  Array *this_local;
  
  this_00 = array(this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
  if (bVar1) {
    pSVar2 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&this_00->sp);
    local_1c = pSVar2->size;
  }
  else {
    sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      (&this_00->elements);
    local_1c = (int)sVar3;
  }
  return local_1c;
}

Assistant:

int
Array::size() const
{
    auto a = array();
    return a->sp ? a->sp->size : int(a->elements.size());
}